

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDescriptor.cpp
# Opt level: O3

void extractDescriptor(Mat *in,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPointRotation
                      ,vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor)

{
  Point2f PVar1;
  pointer pKVar2;
  Mat *pMVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int n;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  pointer pKVar14;
  long lVar15;
  pointer pKVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  vector<float,_std::allocator<float>_> bin;
  Mat angle;
  Mat M;
  Mat window;
  Mat matBin;
  Mat gKernel;
  vector<float,_std::allocator<float>_> local_2e8;
  float local_2cc;
  pointer local_2c8;
  Mat *local_2c0;
  vector<Descriptor,_std::allocator<Descriptor>_> *local_2b8;
  pointer local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  Point2f local_298;
  undefined8 uStack_290;
  undefined1 local_280 [16];
  undefined8 local_270 [12];
  Mat local_210 [16];
  long local_200;
  long *local_1c8;
  Mat local_1b0 [16];
  long local_1a0;
  long *local_168;
  Mat local_150 [16];
  long local_140;
  long *local_108;
  Mat local_f0 [16];
  void *local_e0;
  Mat local_90 [96];
  
  local_2b8 = keyPointDescriptor;
  cv::Mat::Mat(local_90);
  pKVar14 = (keyPointRotation->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pKVar16 = (keyPointRotation->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  pKVar2 = pKVar16;
  pMVar3 = in;
  if (pKVar14 != pKVar16) {
    do {
      local_2c0 = pMVar3;
      local_2c8 = pKVar2;
      PVar1 = pKVar14->pt;
      fVar18 = PVar1.x;
      fVar19 = PVar1.y;
      if ((((8.0 < fVar18) && (fVar18 < (float)(*(int *)(in + 0xc) + -9))) && (8.0 < fVar19)) &&
         (fVar19 < (float)(*(int *)(in + 8) + -9))) {
        local_2cc = pKVar14->angle;
        uStack_290 = 0;
        local_2a8 = CONCAT44((int)(fVar19 + -8.0 + -1.0),(int)(fVar18 + -8.0 + -1.0));
        local_2a0 = 0x1200000012;
        local_298 = PVar1;
        cv::Mat::Mat(local_150,in,(Rect_ *)&local_2a8);
        local_270[0]._0_1_ = (Mat)0x0;
        local_270[0]._1_7_ = 0;
        local_280._0_4_ = 0x2010000;
        local_280._8_8_ = local_150;
        cv::Mat::convertTo((_OutputArray *)local_150,(int)local_280,1.0,0.0);
        cv::Mat::Mat(local_1b0,0x10,0x10,5);
        local_2b0 = pKVar14;
        cv::Mat::Mat(local_210,0x10,0x10,5);
        lVar15 = 2;
        lVar11 = 0;
        lVar12 = 1;
        do {
          lVar6 = lVar12 + 1;
          lVar7 = 0;
          do {
            lVar9 = *local_108;
            lVar5 = lVar9 * lVar12 + local_140;
            fVar18 = *(float *)(lVar7 + 4 + lVar15 * lVar9 + local_140) -
                     *(float *)(lVar7 + 4 + lVar11 * lVar9 + local_140);
            fVar19 = *(float *)(lVar7 + 8 + lVar5) - *(float *)(lVar7 + lVar5);
            *(float *)(lVar7 + *local_168 * lVar11 + local_1a0) =
                 SQRT(fVar19 * fVar19 + fVar18 * fVar18);
            fVar18 = atan2f(fVar18,fVar19);
            fVar18 = (fVar18 * 180.0) / 3.1415927;
            fVar18 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar18 |
                            (uint)(fVar18 + 360.0) & -(uint)(fVar18 < 0.0)) - local_2cc;
            *(uint *)(lVar7 + *local_1c8 * lVar11 + local_200) =
                 ~-(uint)(fVar18 < 0.0) & (uint)fVar18 |
                 (uint)(fVar18 + 360.0) & -(uint)(fVar18 < 0.0);
            lVar7 = lVar7 + 4;
          } while (lVar7 != 0x40);
          lVar11 = lVar11 + 1;
          lVar15 = lVar15 + 1;
          lVar12 = lVar6;
        } while (lVar6 != 0x11);
        local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar13 = 0;
        do {
          lVar12 = 0;
          uVar8 = 0;
          do {
            puVar4 = (undefined8 *)operator_new(0x20);
            puVar4[2] = 0;
            puVar4[3] = 0;
            *puVar4 = 0;
            puVar4[1] = 0;
            lVar11 = *local_1c8;
            lVar15 = *local_168;
            lVar6 = uVar13 * lVar15 + lVar12 + local_1a0;
            lVar7 = uVar13 * lVar11 + lVar12 + local_200;
            lVar9 = 0;
            do {
              lVar5 = 0;
              do {
                lVar10 = (long)(int)(*(float *)(lVar7 + lVar5 * 4) / 45.0);
                *(float *)((long)puVar4 + lVar10 * 4) =
                     *(float *)(lVar6 + lVar5 * 4) + *(float *)((long)puVar4 + lVar10 * 4);
                lVar5 = lVar5 + 1;
              } while (lVar5 != 4);
              lVar9 = lVar9 + 1;
              lVar6 = lVar6 + lVar15;
              lVar7 = lVar7 + lVar11;
            } while (lVar9 != 4);
            std::vector<float,std::allocator<float>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                      ((vector<float,std::allocator<float>> *)&local_2e8,
                       local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,puVar4,puVar4 + 4);
            operator_delete(puVar4,0x20);
            lVar12 = lVar12 + 0x10;
            bVar17 = uVar8 < 0xc;
            uVar8 = uVar8 + 4;
          } while (bVar17);
          bVar17 = uVar13 < 0xc;
          uVar13 = uVar13 + 4;
        } while (bVar17);
        normVector(&local_2e8);
        pKVar14 = local_2b0;
        in = local_2c0;
        if ((long)local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar12 = (long)local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          lVar11 = 0;
          do {
            if (0.2 < local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar11]) {
              local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11] = 0.2;
            }
            lVar11 = lVar11 + 1;
          } while (lVar12 + (ulong)(lVar12 == 0) != lVar11);
        }
        normVector(&local_2e8);
        cv::Mat::Mat(local_f0,1,0x80,5);
        memcpy(local_e0,local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
               (long)local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
        local_280._4_4_ = (int)local_298.y;
        local_280._0_4_ = (int)local_298.x;
        local_280._8_8_ = local_280._8_8_ & 0xffffffffffffff00;
        cv::Mat::Mat((Mat *)local_270,local_f0);
        std::vector<Descriptor,_std::allocator<Descriptor>_>::emplace_back<Descriptor>
                  (local_2b8,(Descriptor *)local_280);
        cv::Mat::~Mat((Mat *)local_270);
        cv::Mat::~Mat(local_f0);
        if (local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        cv::Mat::~Mat(local_210);
        cv::Mat::~Mat(local_1b0);
        cv::Mat::~Mat(local_150);
        pKVar16 = local_2c8;
      }
      pKVar14 = pKVar14 + 1;
      pKVar2 = local_2c8;
      pMVar3 = local_2c0;
    } while (pKVar14 != pKVar16);
  }
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void extractDescriptor(const Mat& in, const vector<KeyPoint>& keyPointRotation, vector<Descriptor>& keyPointDescriptor) {
	int wSize = 18;
	int halfWSize = (wSize - 2) / 2;
	int nBin = 36;
	int intervalBin = 360 / nBin;
	Mat gKernel;
	//getGaussianWeight(gKernel, wSize-2);
	
	for (KeyPoint point : keyPointRotation) {
		//discard key points to avoid corner conditions
		if (point.pt.x <= halfWSize || point.pt.x >= in.cols - halfWSize - 1 || point.pt.y <= halfWSize || point.pt.y >= in.rows - halfWSize - 1) continue;

		Rect patch = Rect(point.pt.x - halfWSize - 1, point.pt.y - halfWSize - 1, wSize, wSize);
		Mat window = Mat(in, patch);
		window.convertTo(window, CV_32F);
		Mat M = Mat(wSize-2, wSize-2, CV_32F);
		Mat angle = Mat(wSize-2, wSize-2, CV_32F);

		for (int i = 1; i < wSize-1; ++i) {
			for (int j = 1; j < wSize-1; ++j) {
				float diffI = window.at<float>(i + 1, j) - window.at<float>(i - 1, j);
				float diffJ = window.at<float>(i, j + 1) - window.at<float>(i, j - 1);
				float m = sqrt(pow(diffI, 2.0) + pow(diffJ, 2.0));
				M.at<float>(i - 1, j - 1) = m; //*gKernel.at<float>(i - 1, j - 1);
				float theta = atan2(diffI, diffJ) * 180 / M_PI;
				if (theta < 0) theta += 360;

				//normalize rotation
				theta -= point.angle;
				if (theta < 0) theta += 360;
				angle.at<float>(i - 1, j - 1) = theta;
			}
		}

		vector<float> bin;

		for (int i = 0; i < wSize-2; i+=4) {
			for (int j = 0; j < wSize-2; j+=4) {
				vector<float> gridBin(8,0);
				for (int m = 0; m < 4; ++m) {
					for (int n = 0; n < 4; ++n) {
						int pI = i + m;
						int pJ = j + n;
						int binIdx = static_cast<int>(angle.at<float>(pI , pJ) / 45);
						gridBin[binIdx] += M.at<float>(pI,pJ);
					}
				}
				bin.insert(bin.end(), gridBin.begin(), gridBin.end());
			}
		}

		//normalize+contrast invariance
		normVector(bin);
		for (int i = 0; i < bin.size(); ++i) {
			if (bin[i] > 0.2) bin[i] = 0.2;
		}
		normVector(bin);

		Mat matBin = Mat(1,128,CV_32F);
		//copy vector to mat in one row instead of one col
		memcpy(matBin.data, bin.data(), bin.size() * sizeof(float));

		keyPointDescriptor.push_back(Descriptor(point.pt.x, point.pt.y, matBin));
	}

}